

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O3

int luaL_getmetafield(lua_State *L,int idx,char *field)

{
  ulong uVar1;
  int iVar2;
  size_t lenx;
  GCstr *key;
  cTValue *pcVar3;
  int iVar4;
  
  iVar2 = lua_getmetatable(L,idx);
  iVar4 = 0;
  if (iVar2 != 0) {
    uVar1 = L->top[-1].u64;
    lenx = strlen(field);
    key = lj_str_new(L,field,lenx);
    pcVar3 = lj_tab_getstr((GCtab *)(uVar1 & 0x7fffffffffff),key);
    if ((pcVar3 == (cTValue *)0x0) || (pcVar3->u64 == 0xffffffffffffffff)) {
      L->top = L->top + -1;
      iVar4 = 0;
    }
    else {
      L->top[-1] = (TValue)pcVar3->u64;
      iVar4 = 1;
    }
  }
  return iVar4;
}

Assistant:

LUALIB_API int luaL_getmetafield(lua_State *L, int idx, const char *field)
{
  if (lua_getmetatable(L, idx)) {
    cTValue *tv = lj_tab_getstr(tabV(L->top-1), lj_str_newz(L, field));
    if (tv && !tvisnil(tv)) {
      copyTV(L, L->top-1, tv);
      return 1;
    }
    L->top--;
  }
  return 0;
}